

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

char * Diligent::GetAdapterTypeString(ADAPTER_TYPE AdapterType,bool bGetEnumString)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  string msg;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,AdapterType) & 0xffffffff) {
  case 0:
    pcVar2 = "ADAPTER_TYPE_UNKNOWN";
    pcVar1 = "Unknown";
    break;
  case 1:
    pcVar2 = "ADAPTER_TYPE_SOFTWARE";
    pcVar1 = "Software";
    break;
  case 2:
    pcVar2 = "ADAPTER_TYPE_INTEGRATED";
    pcVar1 = "Integrated";
    break;
  case 3:
    pcVar2 = "ADAPTER_TYPE_DISCRETE";
    pcVar1 = "Discrete";
    break;
  default:
    FormatString<char[33]>(&local_28,(char (*) [33])"Unknown/unsupported adapter type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetAdapterTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (bGetEnumString) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* GetAdapterTypeString(ADAPTER_TYPE AdapterType, bool bGetEnumString)
{
    static_assert(ADAPTER_TYPE_COUNT == 4, "Did you add a new adapter type? Please update the switch below.");
    switch (AdapterType)
    {
        // clang-format off
        case ADAPTER_TYPE_UNKNOWN:    return bGetEnumString ? "ADAPTER_TYPE_UNKNOWN"    : "Unknown";    break;
        case ADAPTER_TYPE_SOFTWARE:   return bGetEnumString ? "ADAPTER_TYPE_SOFTWARE"   : "Software";   break;
        case ADAPTER_TYPE_INTEGRATED: return bGetEnumString ? "ADAPTER_TYPE_INTEGRATED" : "Integrated"; break;
        case ADAPTER_TYPE_DISCRETE:   return bGetEnumString ? "ADAPTER_TYPE_DISCRETE"   : "Discrete";   break;
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported adapter type"); return "UNKNOWN";
    }
}